

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_VectorFancyOpts_Test::TestBody(TApp_VectorFancyOpts_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *pOVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertHelper local_158;
  allocator local_149;
  AssertHelper local_148;
  allocator_type local_139;
  AssertionResult gtest_ar;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  answer;
  string local_80;
  string local_60;
  string local_40;
  
  strvec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strvec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strvec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&gtest_ar,"mystring",(allocator *)&local_158);
  std::__cxx11::string::string(local_118,"mystring2",(allocator *)&local_148);
  std::__cxx11::string::string(local_f8,"mystring3",&local_149);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&answer,__l,&local_139);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string((string *)&local_40,"-s,--string",(allocator *)&gtest_ar);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_158);
  this_00 = &(this->super_TApp).app;
  pOVar3 = CLI::App::add_option<std::__cxx11::string>(this_00,&local_40,&strvec,&local_60);
  (pOVar3->super_OptionBase<CLI::Option>).required_ = true;
  pOVar3 = CLI::Option::expected(pOVar3,3);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  local_158.data_._0_4_ = 3;
  local_148.data_._0_4_ = pOVar3->expected_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","opt->get_expected()",(int *)&local_158,(int *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3ba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&gtest_ar,"--string",(allocator *)&local_158);
  std::__cxx11::string::string(local_118,"mystring",(allocator *)&local_148);
  std::__cxx11::string::string(local_f8,"mystring2",&local_149);
  std::__cxx11::string::string(local_d8,"mystring3",(allocator *)&local_139);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             &strvec);
  lVar4 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run(&this->super_TApp);
  local_158.data_ = (AssertHelperData *)0x3;
  std::__cxx11::string::string((string *)&local_80,"--string",&local_149);
  local_148.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_80);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)3","app.count(\"--string\")",(unsigned_long *)&local_158
             ,(unsigned_long *)&local_148);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"answer","strvec",&answer,&strvec);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3bf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&gtest_ar,"one",(allocator *)&local_158);
  std::__cxx11::string::string(local_118,"two",(allocator *)&local_148);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&gtest_ar,
             local_f8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3c3,
             "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  CLI::App::reset(this_00);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3c6,
             "Expected: run() throws an exception of type CLI::ParseError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&answer);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strvec);
  return;
}

Assistant:

TEST_F(TApp, VectorFancyOpts) {
    std::vector<std::string> strvec;
    std::vector<std::string> answer{"mystring", "mystring2", "mystring3"};

    CLI::Option *opt = app.add_option("-s,--string", strvec)->required()->expected(3);
    EXPECT_EQ(3, opt->get_expected());

    args = {"--string", "mystring", "mystring2", "mystring3"};
    run();
    EXPECT_EQ((size_t)3, app.count("--string"));
    EXPECT_EQ(answer, strvec);

    app.reset();
    args = {"one", "two"};
    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();
    EXPECT_THROW(run(), CLI::ParseError);
}